

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall dg::vr::StructureAnalyzer::collectAllocatedAreas(StructureAnalyzer *this)

{
  Value VVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  Value *val;
  long lVar8;
  long *plVar9;
  CallInst *call;
  AllocaInst *alloca;
  Value *local_40;
  Value *local_38;
  
  lVar2 = *(long *)this;
  plVar9 = (long *)(lVar2 + 0x20);
  while (lVar3 = *plVar9, lVar3 != lVar2 + 0x18) {
    lVar7 = lVar3 + -0x38;
    if (lVar3 == 0) {
      lVar7 = 0;
    }
    plVar9 = (long *)(lVar7 + 0x50);
    while (lVar4 = *plVar9, lVar4 != lVar7 + 0x48) {
      lVar8 = lVar4 + -0x18;
      if (lVar4 == 0) {
        lVar8 = 0;
      }
      plVar9 = (long *)(lVar8 + 0x30);
      while (lVar5 = *plVar9, lVar5 != lVar8 + 0x28) {
        val = (Value *)(lVar5 + -0x18);
        if (lVar5 == 0) {
          val = (Value *)0x0;
        }
        VVar1 = val[0x10];
        local_38 = val;
        if (VVar1 != (Value)0x3a) {
          local_38 = (Value *)0x0;
        }
        if (VVar1 == (Value)0x3a && lVar5 != 0) {
          std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
          emplace_back<llvm::AllocaInst_const*&>
                    ((vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>> *)
                     (this + 0xb8),(AllocaInst **)&local_38);
        }
        else {
          local_40 = val;
          if (VVar1 != (Value)0x53) {
            local_40 = (Value *)0x0;
          }
          if (VVar1 == (Value)0x53 && lVar5 != 0) {
            bVar6 = isValidAllocationCall(val);
            if (bVar6) {
              std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
              emplace_back<llvm::CallInst_const*&>
                        ((vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>> *)
                         (this + 0xb8),(CallInst **)&local_40);
            }
          }
        }
        plVar9 = (long *)(lVar5 + 8);
      }
      plVar9 = (long *)(lVar4 + 8);
    }
    plVar9 = (long *)(lVar3 + 8);
  }
  return;
}

Assistant:

void StructureAnalyzer::collectAllocatedAreas() {
    // compute allocated areas throughout the code
    for (const llvm::Function &function : module) {
        for (const llvm::BasicBlock &block : function) {
            for (const llvm::Instruction &inst : block) {
                if (const auto *alloca =
                            llvm::dyn_cast<llvm::AllocaInst>(&inst)) {
                    allocatedAreas.emplace_back(alloca);
                }

                else if (const auto *call =
                                 llvm::dyn_cast<llvm::CallInst>(&inst)) {
                    if (isValidAllocationCall(call)) {
                        allocatedAreas.emplace_back(call);
                    }
                }
            }
        }
    }
}